

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall PClassActor::PClassActor(PClassActor *this)

{
  PClass::PClass(&this->super_PClass);
  (this->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.super_DObject.
  _vptr_DObject = (_func_int **)&PTR_StaticType_008484e0;
  (this->VisibleToPlayerClass).Array = (PClassPlayerPawn **)0x0;
  (this->VisibleToPlayerClass).Most = 0;
  (this->VisibleToPlayerClass).Count = 0;
  (this->Obituary).Chars = FString::NullString.Nothing;
  (this->HitObituary).Chars = FString::NullString.Nothing;
  this->HowlSound = 0;
  this->BloodType = 0;
  this->BloodType2 = 0;
  this->BloodType3 = 0;
  (this->SourceLumpName).Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  (this->MissileName).Index = 0;
  this->GameFilter = '\0';
  this->SpawnID = 0;
  this->DoomEdNum = -1;
  this->OwnedStates = (FState *)0x0;
  this->Replacement = (PClassActor *)0x0;
  *(undefined8 *)((long)&this->Replacement + 4) = 0;
  *(undefined8 *)((long)&this->Replacee + 4) = 0;
  this->StateList = (FStateLabels *)0x0;
  this->DamageFactors = (DmgFactors *)0x0;
  this->PainChances = (PainChanceList *)0x0;
  this->DeathHeight = -1.0;
  this->BurnHeight = -1.0;
  this->GibHealth = -0x80000000;
  this->WoundHealth = 6;
  this->PoisonDamage = 0;
  this->FastSpeed = -1.0;
  this->RDFactor = 1.0;
  this->CameraHeight = -2147483648.0;
  this->DropItems = (DDropItem *)0x0;
  this->DontHurtShooter = false;
  this->ExplosionRadius = -1;
  this->MeleeDamage = 0;
  this->MeleeSound = 0;
  TArray<PClassActor_*,_PClassActor_*>::Grow(&AllActorClasses,1);
  AllActorClasses.Array[AllActorClasses.Count] = this;
  AllActorClasses.Count = AllActorClasses.Count + 1;
  return;
}

Assistant:

PClassActor::PClassActor()
{
	GameFilter = GAME_Any;
	SpawnID = 0;
	DoomEdNum = -1;
	OwnedStates = NULL;
	NumOwnedStates = 0;
	Replacement = NULL;
	Replacee = NULL;
	StateList = NULL;
	DamageFactors = NULL;
	PainChances = NULL;

	DeathHeight = -1;
	BurnHeight = -1;
	GibHealth = INT_MIN;
	WoundHealth = 6;
	PoisonDamage = 0;
	FastSpeed = -1.;
	RDFactor = 1.;
	CameraHeight = INT_MIN;

	DropItems = NULL;

	DontHurtShooter = false;
	ExplosionRadius = -1;
	MeleeDamage = 0;

	// Record this in the master list.
	AllActorClasses.Push(this);
}